

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> * __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets
          (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           *__return_storage_ptr__,cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *this_00;
  iterator __position;
  undefined8 uVar3;
  cmGlobalGenerator *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  int iVar10;
  pointer ppcVar11;
  char *pcVar12;
  pointer ppcVar13;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> filteredTargets;
  string qtMajorVersion;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  allocator local_f9;
  undefined1 local_f8 [32];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_98;
  ulong local_80;
  string local_78;
  string local_58;
  cmGlobalGenerator *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppcVar11 = (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar11) {
    local_80 = 0;
    local_38 = this;
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_98,&ppcVar11[local_80]->GeneratorTargets);
      local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start = (cmGeneratorTarget **)0x0;
      local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (cmGeneratorTarget **)0x0;
      local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (cmGeneratorTarget **)0x0;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
                (&local_d8,
                 (long)local_98.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      for (ppcVar13 = local_98.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; pcVar4 = local_38,
          ppcVar13 !=
          local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar13 = ppcVar13 + 1) {
        TVar9 = cmGeneratorTarget::GetType(*ppcVar13);
        if ((TVar9 != GLOBAL_TARGET) &&
           ((((TVar9 = cmGeneratorTarget::GetType(*ppcVar13), TVar9 == EXECUTABLE ||
              (TVar9 = cmGeneratorTarget::GetType(*ppcVar13), TVar9 == STATIC_LIBRARY)) ||
             (TVar9 = cmGeneratorTarget::GetType(*ppcVar13), TVar9 == SHARED_LIBRARY)) ||
            ((TVar9 = cmGeneratorTarget::GetType(*ppcVar13), TVar9 == MODULE_LIBRARY ||
             (TVar9 = cmGeneratorTarget::GetType(*ppcVar13), TVar9 == OBJECT_LIBRARY)))))) {
          pcVar2 = *ppcVar13;
          local_b8._M_allocated_capacity = (size_type)&local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"AUTOMOC","");
          bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)&local_b8);
          if (bVar5) {
LAB_003565d6:
            bVar6 = false;
LAB_003565d9:
            bVar7 = cmGeneratorTarget::IsImported(*ppcVar13);
            if (bVar6) {
              bVar6 = !bVar5;
              goto LAB_00356645;
            }
            if (!bVar5) goto LAB_00356672;
          }
          else {
            pcVar2 = *ppcVar13;
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"AUTOUIC","");
            bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_58);
            if (bVar6) goto LAB_003565d6;
            pcVar2 = *ppcVar13;
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"AUTORCC","");
            bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_78);
            bVar6 = true;
            bVar7 = true;
            if (bVar8) goto LAB_003565d9;
LAB_00356645:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (bVar6) {
LAB_00356672:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_allocated_capacity != &local_a8) {
            operator_delete((void *)local_b8._M_allocated_capacity,
                            local_a8._M_allocated_capacity + 1);
          }
          if (bVar7 == false) {
            this_00 = (*ppcVar13)->Target->Makefile;
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"QT_VERSION_MAJOR","");
            pcVar12 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f8);
            std::__cxx11::string::string((string *)local_b8._M_local_buf,pcVar12,&local_f9);
            if ((cmGeneratorTarget *)local_f8._0_8_ != (cmGeneratorTarget *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            iVar10 = std::__cxx11::string::compare(local_b8._M_local_buf);
            if (iVar10 == 0) {
              local_f8._0_8_ = local_f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f8,"Qt5Core_VERSION_MAJOR","");
              pcVar12 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f8);
              uVar3 = local_b8._8_8_;
              strlen(pcVar12);
              std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)uVar3,(ulong)pcVar12);
              if ((cmGeneratorTarget *)local_f8._0_8_ != (cmGeneratorTarget *)(local_f8 + 0x10)) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
              }
            }
            iVar10 = std::__cxx11::string::compare(local_b8._M_local_buf);
            if ((iVar10 == 0) ||
               (iVar10 = std::__cxx11::string::compare(local_b8._M_local_buf), iVar10 == 0)) {
              local_f8._0_8_ = *ppcVar13;
              cmQtAutoGeneratorInitializer::InitializeAutogenSources
                        ((cmGeneratorTarget *)local_f8._0_8_);
              if (local_d8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_d8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
                _M_realloc_insert<cmGeneratorTarget*const&>
                          ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
                           &local_d8,
                           (iterator)
                           local_d8.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(cmGeneratorTarget **)local_f8
                          );
              }
              else {
                *local_d8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = (cmGeneratorTarget *)local_f8._0_8_;
                local_d8.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_d8.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_allocated_capacity != &local_a8) {
              operator_delete((void *)local_b8._M_allocated_capacity,
                              local_a8._M_allocated_capacity + 1);
            }
          }
        }
      }
      ppcVar13 = local_d8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmQtAutoGeneratorInitializer::InitializeAutogenTarget
                    ((pcVar4->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_80],*ppcVar13);
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       __return_storage_ptr__,__position,ppcVar13);
          }
          else {
            *__position._M_current = *ppcVar13;
            pppcVar1 = &(__return_storage_ptr__->
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          ppcVar13 = ppcVar13 + 1;
        } while (ppcVar13 !=
                 local_d8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (cmGeneratorTarget **)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_80 = (ulong)((int)local_80 + 1);
      ppcVar11 = (pcVar4->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
    } while (local_80 <
             (ulong)((long)(pcVar4->LocalGenerators).
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar11 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const cmGeneratorTarget*>
cmGlobalGenerator::CreateQtAutoGeneratorsTargets()
{
  std::vector<const cmGeneratorTarget*> autogenTargets;

#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    std::vector<cmGeneratorTarget*> targets =
      this->LocalGenerators[i]->GetGeneratorTargets();
    std::vector<cmGeneratorTarget*> filteredTargets;
    filteredTargets.reserve(targets.size());
    for(std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      if ((*ti)->GetType() == cmState::GLOBAL_TARGET)
        {
        continue;
        }
      if((*ti)->GetType() != cmState::EXECUTABLE &&
         (*ti)->GetType() != cmState::STATIC_LIBRARY &&
         (*ti)->GetType() != cmState::SHARED_LIBRARY &&
         (*ti)->GetType() != cmState::MODULE_LIBRARY &&
         (*ti)->GetType() != cmState::OBJECT_LIBRARY)
        {
        continue;
        }
      if((!(*ti)->GetPropertyAsBool("AUTOMOC")
            && !(*ti)->GetPropertyAsBool("AUTOUIC")
            && !(*ti)->GetPropertyAsBool("AUTORCC"))
          || (*ti)->IsImported())
        {
        continue;
        }
      // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
      cmMakefile* mf = (*ti)->Target->GetMakefile();
      std::string qtMajorVersion = mf->GetSafeDefinition("QT_VERSION_MAJOR");
      if (qtMajorVersion == "")
        {
        qtMajorVersion = mf->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
        }
      if (qtMajorVersion != "4" && qtMajorVersion != "5")
        {
        continue;
        }

      cmGeneratorTarget* gt = *ti;

      cmQtAutoGeneratorInitializer::InitializeAutogenSources(gt);
      filteredTargets.push_back(gt);
      }
    for(std::vector<cmGeneratorTarget*>::iterator ti = filteredTargets.begin();
        ti != filteredTargets.end(); ++ti)
      {
      cmQtAutoGeneratorInitializer::InitializeAutogenTarget(
           this->LocalGenerators[i], *ti);
      autogenTargets.push_back(*ti);
      }
    }
#endif
  return autogenTargets;
}